

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O2

void __thiscall
BSP<int>::runAndWait
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *input,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *output,bool setAffinity)

{
  ostream *poVar1;
  runtime_error *this_00;
  uint uVar2;
  uint __val;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> lockableVectors;
  UTimer timer;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::vector
            (&lockableVectors,
             ((long)(output->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(output->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&timer);
  setupWorkers(this,setAffinity);
  swapVectors(this,output,&lockableVectors);
  __val = 0;
  uVar2 = 0;
  do {
    if ((uVar2 == this->EOC_FLAG) ||
       ((int)((ulong)((long)(this->supersteps).
                            super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->supersteps).
                           super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)__val)) {
      std::
      _Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_Vector_impl_data::_M_swap_data((_Vector_impl_data *)output,(_Vector_impl_data *)input);
      std::
      for_each<__gnu_cxx::__normal_iterator<WorkerThread*,std::vector<WorkerThread,std::allocator<WorkerThread>>>,BSP<int>::runAndWait(std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,bool)::_lambda(WorkerThread&)_1_>
                ((this->workers).super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (this->workers).super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::~vector
                (&lockableVectors);
      return;
    }
    std::__cxx11::to_string(&local_70,__val);
    std::operator+(&local_50,"Superstep ",&local_70);
    UTimer::UTimer(&timer,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    poVar1 = std::operator<<((ostream *)&std::cout,"\n\nRunning superstep  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,__val);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = Superstep<int>::runStep
                      ((this->supersteps).
                       super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[__val].
                       super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &this->workers,input,&lockableVectors);
    if (uVar2 == this->NEXT_STEP_FLAG) {
      __val = __val + 1;
    }
    else if ((uVar2 != this->EOC_FLAG) && (__val = uVar2, (int)uVar2 < 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Wrong number of superstep returned by \'atExit\' function");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    swapVectors(this,input,&lockableVectors);
    UTimer::~UTimer(&timer);
  } while( true );
}

Assistant:

void BSP<T>::runAndWait (std::vector<std::vector<T>> &input, std::vector<std::vector<T>> &output, bool setAffinity) {
	int retVal		= 0;
	int nextStep	= 0;
	std::vector<LockableVector<T>> lockableVectors (output.size());

	setupWorkers (setAffinity);

	swapVectors (output, lockableVectors);
	

	while (retVal != EOC_FLAG && nextStep < (int) supersteps.size()) {

		{
			UTimer timer ("Superstep " + std::to_string (nextStep));
			std::cout << "\n\nRunning superstep  " << nextStep << std::endl;

			retVal	= supersteps[nextStep]->runStep (workers, input, lockableVectors);

			// Swapping vectors
			if (retVal == NEXT_STEP_FLAG) {
				nextStep++;
			}
			else if (retVal == EOC_FLAG) {
				// Do nothing
			}
			else if (retVal>=0) {
				nextStep	= retVal;
			}
			else
				throw std::runtime_error ("Wrong number of superstep returned by 'atExit' function");

			swapVectors (input, lockableVectors);
		}
	}

	
	std::swap (output, input);

	std::for_each (workers.begin(), workers.end(), [] (WorkerThread &w) {
		w.stopWorker ();
	});
}